

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::Uniform::streamDefinition(Uniform *this,ostringstream *str)

{
  string *psVar1;
  ostream *poVar2;
  ostringstream *str_local;
  Uniform *this_local;
  
  psVar1 = glcts::(anonymous_namespace)::UniformType::str_abi_cxx11_((UniformType *)this);
  poVar2 = std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar1
                          );
  poVar2 = std::operator<<(poVar2," ");
  std::operator<<(poVar2,(string *)&this->shortName);
  UniformType::streamArrayStr(&this->type,str,-1);
  return;
}

Assistant:

void streamDefinition(std::ostringstream& str) const
	{
		str << type.str() << " " << shortName;
		type.streamArrayStr(str);
	}